

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O3

StringTree * __thiscall
kj::strTree<char_const(&)[25],kj::StringPtr,char_const(&)[20],unsigned_int&,char_const(&)[30]>
          (StringTree *__return_storage_ptr__,kj *this,char (*params) [25],StringPtr *params_1,
          char (*params_2) [20],uint *params_3,char (*params_4) [30])

{
  undefined1 local_78 [16];
  ArrayPtr<const_char> local_68;
  ArrayPtr<const_char> local_58;
  CappedArray<char,_14UL> local_48;
  
  strlen((char *)this);
  local_58.ptr = *(char **)*params;
  local_58.size_ = *(long *)(*params + 8) - 1;
  local_68.size_ = strlen((char *)params_1);
  local_68.ptr = (char *)params_1;
  _::Stringifier::operator*(&local_48,(Stringifier *)&_::STR,*(uint *)*params_2);
  local_78._8_8_ = strlen((char *)params_3);
  local_78._0_8_ = params_3;
  StringTree::
  concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(StringTree *)&stack0xffffffffffffff78,&local_58,&local_68,
             (ArrayPtr<const_char> *)&local_48,(CappedArray<char,_14UL> *)local_78,
             (ArrayPtr<const_char> *)this);
  return __return_storage_ptr__;
}

Assistant:

StringTree strTree(Params&&... params) {
  return StringTree::concat(_::toStringTreeOrCharSequence(kj::fwd<Params>(params))...);
}